

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O2

int amqp_encode_table(amqp_bytes_t encoded,amqp_table_t *input,size_t *offset)

{
  ulong uVar1;
  size_t sVar2;
  undefined8 uVar3;
  size_t sVar4;
  size_t __n;
  void *__src;
  uint8_t res;
  int iVar5;
  uint uVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  
  pvVar8 = encoded.bytes;
  uVar9 = encoded.len;
  sVar2 = *offset;
  *offset = sVar2 + 4;
  lVar7 = -1;
  lVar10 = 0x10;
  do {
    lVar7 = lVar7 + 1;
    if (input->num_entries <= lVar7) {
      if (sVar2 + 4 <= uVar9) {
        uVar6 = ((int)*offset - (int)sVar2) - 4;
        *(uint *)((long)pvVar8 + sVar2) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 * 0x1000000;
        return 0;
      }
      return -0xb;
    }
    uVar3 = *(undefined8 *)((long)input->entries + lVar10 + -0x10);
    sVar4 = *offset;
    uVar1 = sVar4 + 1;
    *offset = uVar1;
    if (uVar9 < uVar1) {
      return -0xb;
    }
    *(char *)((long)pvVar8 + sVar4) = (char)uVar3;
    __n = *(size_t *)((long)input->entries + lVar10 + -0x10);
    __src = *(void **)((long)input->entries + lVar10 + -8);
    sVar4 = *offset;
    uVar1 = sVar4 + __n;
    *offset = uVar1;
    if (uVar9 < uVar1) {
      return -0xb;
    }
    memcpy((void *)(sVar4 + (long)pvVar8),__src,__n);
    iVar5 = amqp_encode_field_value
                      (encoded,(amqp_field_value_t *)((long)&(input->entries->key).len + lVar10),
                       offset);
    lVar10 = lVar10 + 0x28;
  } while (-1 < iVar5);
  return iVar5;
}

Assistant:

int amqp_encode_table(amqp_bytes_t encoded,
                      amqp_table_t *input,
                      size_t *offset)
{
  size_t start = *offset;
  int i, res;

  *offset += 4; /* size of the table gets filled in later on */

  for (i = 0; i < input->num_entries; i++) {
    if (!amqp_encode_8(encoded, offset, input->entries[i].key.len)) {
      res = AMQP_STATUS_TABLE_TOO_BIG;
      goto out;
    }

    if (!amqp_encode_bytes(encoded, offset, input->entries[i].key)) {
      res = AMQP_STATUS_TABLE_TOO_BIG;
      goto out;
    }

    res = amqp_encode_field_value(encoded, &input->entries[i].value, offset);
    if (res < 0) {
      goto out;
    }
  }

  if (!amqp_encode_32(encoded, &start, *offset - start - 4)) {
    res = AMQP_STATUS_TABLE_TOO_BIG;
    goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}